

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O3

void __thiscall
ON_PointCloud::ON_PointCloud(ON_PointCloud *this,double *P0,int dim,bool is_rat,int count)

{
  ON_Object::ON_Object((ON_Object *)this);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_008176e0;
  ON_3dPointArray::ON_3dPointArray(&this->m_P,count);
  (this->m_N)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080b7d0;
  (this->m_N).m_a = (ON_3dVector *)0x0;
  (this->m_N).m_count = 0;
  (this->m_N).m_capacity = 0;
  (this->m_C)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00814170;
  (this->m_C).m_a = (ON_Color *)0x0;
  (this->m_C).m_count = 0;
  (this->m_C).m_capacity = 0;
  (this->m_V)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a228;
  (this->m_V).m_a = (double *)0x0;
  (this->m_V).m_count = 0;
  (this->m_V).m_capacity = 0;
  (this->m_H)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00809cc8;
  (this->m_H).m_a = (bool *)0x0;
  (this->m_H).m_count = 0;
  (this->m_H).m_capacity = 0;
  this->m_hidden_count = 0;
  ON_Plane::ON_Plane(&this->m_plane);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  this->m_flags = 0;
  ON_3dPointArray::Create(&this->m_P,dim,(uint)is_rat,count,(uint)is_rat + dim,P0);
  return;
}

Assistant:

ON_PointCloud::ON_PointCloud(const double* P0, int dim, bool is_rat, int count) : m_P(count)
{
  m_P.Create(dim, is_rat, count, dim + is_rat, P0);
}